

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi.cpp
# Opt level: O2

uint m68k_read_disassembler_32(uint addr)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = m68k_read_memory_16(addr);
  uVar2 = m68k_read_memory_16(addr + 2);
  return uVar2 | uVar1 << 0x10;
}

Assistant:

unsigned int m68k_read_disassembler_32 (unsigned int addr)
{
    return m68k_read_memory_16(addr) << 16 | m68k_read_memory_16(addr + 2);
}